

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

uint fmt::v5::internal::
     parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
               (wchar_t **begin,wchar_t *end,
               specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
               *eh)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  uint uVar4;
  
  pwVar1 = *begin;
  if ((pwVar1 == end) || (wVar2 = *pwVar1, 9 < (uint)(wVar2 + L'\xffffffd0'))) {
    __assert_fail("begin != end && \'0\' <= *begin && *begin <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                  ,0x5b0,
                  "unsigned int fmt::internal::parse_nonnegative_int(const Char *&, const Char *, ErrorHandler &&) [Char = wchar_t, ErrorHandler = fmt::internal::specs_checker<fmt::internal::specs_handler<fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<wchar_t>>, wchar_t>>> &]"
                 );
  }
  if (wVar2 == L'0') {
    *begin = pwVar1 + 1;
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    pwVar1 = pwVar1 + 1;
    do {
      pwVar3 = pwVar1;
      if (0xccccccc < uVar4) {
        *begin = pwVar3 + -1;
        uVar4 = 0x80000000;
        goto LAB_0021ee17;
      }
      uVar4 = (uVar4 * 10 + wVar2) - 0x30;
      if (pwVar3 == end) break;
      wVar2 = *pwVar3;
      pwVar1 = pwVar3 + 1;
    } while ((uint)(wVar2 + L'\xffffffd0') < 10);
    *begin = pwVar3;
    if ((int)uVar4 < 0) {
LAB_0021ee17:
      specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::on_error(&eh->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                 ,"number is too big");
    }
  }
  return uVar4;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}